

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConstraintList * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConstraintList,std::span<slang::ast::Constraint_const*,18446744073709551615ul>>
          (BumpAllocator *this,span<const_slang::ast::Constraint_*,_18446744073709551615UL> *args)

{
  pointer ppCVar1;
  size_t sVar2;
  ConstraintList *pCVar3;
  
  pCVar3 = (ConstraintList *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConstraintList *)this->endPtr < pCVar3 + 1) {
    pCVar3 = (ConstraintList *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pCVar3 + 1);
  }
  ppCVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  (pCVar3->super_Constraint).kind = List;
  (pCVar3->super_Constraint).syntax = (ConstraintItemSyntax *)0x0;
  (pCVar3->list)._M_ptr = ppCVar1;
  (pCVar3->list)._M_extent._M_extent_value = sVar2;
  return pCVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }